

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O3

void server_cb(void *arg)

{
  uv_async_t *handle;
  int iVar1;
  int in_ESI;
  uv_async_t *puVar2;
  uv_pipe_t *puVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  uv_loop_t *puVar8;
  uv_idle_t *handle_00;
  uv_loop_t loop;
  uv_loop_t uStack_4e8;
  uv_connect_t local_198;
  void *local_138;
  uv_pipe_t local_130;
  
  puVar4 = &uStack_4e8;
  puVar5 = &uStack_4e8;
  puVar6 = &uStack_4e8;
  puVar7 = &uStack_4e8;
  puVar8 = &uStack_4e8;
  iVar1 = uv_loop_init(&uStack_4e8);
  if (iVar1 == 0) {
    handle = (uv_async_t *)((long)arg + 0x110);
    puVar2 = handle;
    iVar1 = uv_async_init(&uStack_4e8,handle,sv_async_cb);
    in_ESI = (int)puVar2;
    puVar4 = puVar5;
    if (iVar1 != 0) goto LAB_0010bb36;
    uv_unref((uv_handle_t *)handle);
    uv_sem_wait((uv_sem_t *)((long)arg + 0x198));
    *(char **)arg = "server handle";
    puVar3 = &local_130;
    local_138 = arg;
    iVar1 = uv_pipe_init(&uStack_4e8,&local_130,1);
    in_ESI = (int)puVar3;
    puVar4 = puVar6;
    if (iVar1 != 0) goto LAB_0010bb3b;
    uv_pipe_connect(&local_198,&local_130,"/tmp/uv-test-sock",ipc_connect_cb);
    in_ESI = 0;
    iVar1 = uv_run(&uStack_4e8,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0010bb40;
    uv_sem_post((uv_sem_t *)((long)arg + 0x198));
    in_ESI = 0x80;
    iVar1 = uv_listen((uv_stream_t *)arg,0x80,sv_connection_cb);
    puVar7 = (uv_loop_t *)arg;
    if (iVar1 == 0) {
      in_ESI = 0;
      iVar1 = uv_run(&uStack_4e8,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        uv_loop_close(&uStack_4e8);
        return;
      }
      goto LAB_0010bb4a;
    }
  }
  else {
    server_cb_cold_1();
LAB_0010bb36:
    server_cb_cold_2();
LAB_0010bb3b:
    puVar7 = puVar4;
    server_cb_cold_3();
LAB_0010bb40:
    server_cb_cold_4();
  }
  puVar8 = puVar7;
  server_cb_cold_5();
LAB_0010bb4a:
  server_cb_cold_6();
  handle_00 = (uv_idle_t *)((long)puVar8 + 0x60);
  uv_idle_start(handle_00,cl_idle_cb);
  if (in_ESI == 0) {
    return;
  }
  cl_connect_cb_cold_1();
  uv_close((uv_handle_t *)&handle_00[-3].flags,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
  return;
}

Assistant:

static void server_cb(void *arg) {
  struct server_ctx *ctx;
  uv_loop_t loop;

  ctx = arg;
  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_async_init(&loop, &ctx->async_handle, sv_async_cb));
  uv_unref((uv_handle_t*) &ctx->async_handle);

  /* Wait until the main thread is ready. */
  uv_sem_wait(&ctx->semaphore);
  get_listen_handle(&loop, (uv_stream_t*) &ctx->server_handle);
  uv_sem_post(&ctx->semaphore);

  /* Now start the actual benchmark. */
  ASSERT(0 == uv_listen((uv_stream_t*) &ctx->server_handle,
                        128,
                        sv_connection_cb));
  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  uv_loop_close(&loop);
}